

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_platform_posix.c
# Opt level: O0

char * getUserDirByUID(void)

{
  __uid_t __uid;
  passwd *ppVar1;
  size_t sVar2;
  long lVar3;
  size_t add_dirsep;
  size_t dlen;
  char *retval;
  passwd *pw;
  uid_t uid;
  
  __uid = getuid();
  dlen = 0;
  ppVar1 = getpwuid(__uid);
  if (((ppVar1 != (passwd *)0x0) && (ppVar1->pw_dir != (char *)0x0)) && (*ppVar1->pw_dir != '\0')) {
    sVar2 = strlen(ppVar1->pw_dir);
    lVar3 = (long)(int)(uint)(ppVar1->pw_dir[sVar2 - 1] != '/');
    dlen = (size_t)(*__PHYSFS_AllocatorHooks.Malloc)(sVar2 + 1 + lVar3);
    if (((char *)dlen != (char *)0x0) && (strcpy((char *)dlen,ppVar1->pw_dir), lVar3 != 0)) {
      *(char *)(dlen + sVar2) = '/';
      *(char *)(dlen + sVar2 + 1) = '\0';
    }
  }
  return (char *)dlen;
}

Assistant:

static char *getUserDirByUID(void)
{
    uid_t uid = getuid();
    struct passwd *pw;
    char *retval = NULL;

    pw = getpwuid(uid);
    if ((pw != NULL) && (pw->pw_dir != NULL) && (*pw->pw_dir != '\0'))
    {
        const size_t dlen = strlen(pw->pw_dir);
        const size_t add_dirsep = (pw->pw_dir[dlen-1] != '/') ? 1 : 0;
        retval = (char *) allocator.Malloc(dlen + 1 + add_dirsep);
        if (retval != NULL)
        {
            strcpy(retval, pw->pw_dir);
            if (add_dirsep)
            {
                retval[dlen] = '/';
                retval[dlen+1] = '\0';
            } /* if */
        } /* if */
    } /* if */
    
    return retval;
}